

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

DOHcode doh_decode(uchar *doh,size_t dohlen,DNStype dnstype,dohentry *d)

{
  byte bVar1;
  undefined8 uVar2;
  size_t len;
  DOHcode DVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar13;
  uint uVar14;
  size_t sVar16;
  ushort uVar17;
  cnamestore *c;
  bool bVar18;
  uint local_78;
  ushort local_72;
  dohentry *local_70;
  ulong local_68;
  DNStype local_5c;
  dohaddr *local_58;
  ulong local_50;
  cnamestore *local_48;
  cnamestore *local_40;
  ulong local_38;
  DNStype DVar12;
  ulong uVar15;
  
  local_78 = 0xc;
  if (dohlen < 0xc) {
    return DOH_TOO_SMALL_BUFFER;
  }
  if (doh == (uchar *)0x0) {
    return DOH_DNS_BAD_ID;
  }
  if (*doh != '\0') {
    return DOH_DNS_BAD_ID;
  }
  if (doh[1] != '\0') {
    return DOH_DNS_BAD_ID;
  }
  if ((doh[3] & 0xf) != 0) {
    return DOH_DNS_BAD_RCODE;
  }
  uVar17 = *(ushort *)(doh + 4) << 8 | *(ushort *)(doh + 4) >> 8;
  sVar16 = 0xc;
  local_70 = d;
  while (bVar18 = uVar17 != 0, uVar17 = uVar17 - 1, bVar18) {
    DVar3 = skipqname(doh,dohlen,&local_78);
    if (DVar3 != DOH_OK) {
      return DVar3;
    }
    local_78 = local_78 + 4;
    sVar16 = (size_t)local_78;
    if (dohlen < sVar16) {
      return DOH_DNS_OUT_OF_RANGE;
    }
  }
  local_40 = local_70->cname;
  local_58 = local_70->addr;
  DVar12 = 0;
  uVar17 = *(ushort *)(doh + 6) << 8 | *(ushort *)(doh + 6) >> 8;
  uVar9 = local_78;
LAB_003fe019:
  do {
    while( true ) {
      local_78 = uVar9;
      if (uVar17 == 0) {
        uVar17 = *(ushort *)(doh + 8) << 8 | *(ushort *)(doh + 8) >> 8;
        while( true ) {
          bVar18 = uVar17 == 0;
          uVar17 = uVar17 - 1;
          if (bVar18) {
            uVar17 = *(ushort *)(doh + 10) << 8 | *(ushort *)(doh + 10) >> 8;
            while( true ) {
              bVar18 = uVar17 == 0;
              uVar17 = uVar17 - 1;
              if (bVar18) {
                if (sVar16 != dohlen) {
                  return DOH_DNS_MALFORMAT;
                }
                if ((((short)DVar12 != 2) && (local_70->numcname == 0)) && (local_70->numaddr == 0))
                {
                  return DOH_NO_CONTENT;
                }
                return DOH_OK;
              }
              DVar3 = skipqname(doh,dohlen,&local_78);
              if (DVar3 != DOH_OK) {
                return DVar3;
              }
              if (dohlen < local_78 + 8) break;
              if (dohlen < local_78 + 10) {
                return DOH_DNS_OUT_OF_RANGE;
              }
              local_78 = (uint)(ushort)(*(ushort *)(doh + (int)(local_78 + 8)) << 8 |
                                       *(ushort *)(doh + (int)(local_78 + 8)) >> 8) + local_78 + 10;
              sVar16 = (size_t)local_78;
              if (dohlen < sVar16) {
                return DOH_DNS_OUT_OF_RANGE;
              }
            }
            return DOH_DNS_OUT_OF_RANGE;
          }
          DVar3 = skipqname(doh,dohlen,&local_78);
          if (DVar3 != DOH_OK) {
            return DVar3;
          }
          if (dohlen < local_78 + 8) break;
          if (dohlen < local_78 + 10) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          local_78 = (uint)(ushort)(*(ushort *)(doh + (int)(local_78 + 8)) << 8 |
                                   *(ushort *)(doh + (int)(local_78 + 8)) >> 8) + local_78 + 10;
          sVar16 = (size_t)local_78;
          if (dohlen < sVar16) {
            return DOH_DNS_OUT_OF_RANGE;
          }
        }
        return DOH_DNS_OUT_OF_RANGE;
      }
      local_72 = uVar17 - 1;
      DVar3 = skipqname(doh,dohlen,&local_78);
      if (DVar3 != DOH_OK) {
        return DVar3;
      }
      if (dohlen < local_78 + 2) {
        return DOH_DNS_OUT_OF_RANGE;
      }
      uVar11 = *(ushort *)(doh + (int)local_78) << 8 | *(ushort *)(doh + (int)local_78) >> 8;
      DVar12 = (DNStype)uVar11;
      if (uVar11 != 5 && DVar12 != dnstype) {
        return DOH_DNS_UNEXPECTED_TYPE;
      }
      if (dohlen < local_78 + 4) {
        return DOH_DNS_OUT_OF_RANGE;
      }
      if ((ushort)(*(ushort *)(doh + (int)(local_78 + 2)) << 8 |
                  *(ushort *)(doh + (int)(local_78 + 2)) >> 8) != 1) {
        return DOH_DNS_UNEXPECTED_CLASS;
      }
      if (dohlen < local_78 + 8) {
        return DOH_DNS_OUT_OF_RANGE;
      }
      uVar9 = *(uint *)(doh + (int)(local_78 + 4));
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      if (uVar9 < local_70->ttl) {
        local_70->ttl = uVar9;
      }
      uVar13 = local_78 + 10;
      uVar15 = (ulong)uVar13;
      if (dohlen < uVar15) {
        return DOH_DNS_OUT_OF_RANGE;
      }
      uVar8 = *(ushort *)(doh + (int)(local_78 + 8)) << 8 |
              *(ushort *)(doh + (int)(local_78 + 8)) >> 8;
      uVar9 = uVar8 + uVar13;
      sVar16 = (size_t)uVar9;
      if (dohlen < sVar16) {
        return DOH_DNS_OUT_OF_RANGE;
      }
      uVar17 = local_72;
      if (uVar11 != 0x1c) break;
      if (uVar8 != 0x10) {
        return DOH_DNS_RDATA_LEN;
      }
      lVar5 = (long)local_70->numaddr;
      if (lVar5 < 0x18) {
        local_58[lVar5].type = 0x1c;
        uVar2 = *(undefined8 *)(doh + (int)uVar13 + 8);
        *(undefined8 *)&local_58[lVar5].ip = *(undefined8 *)(doh + (int)uVar13);
        *(undefined8 *)((long)&local_58[lVar5].ip + 8) = uVar2;
        iVar4 = local_70->numaddr;
LAB_003fe277:
        local_70->numaddr = iVar4 + 1;
      }
    }
    if (DVar12 != DNS_TYPE_CNAME) {
      if (DVar12 == DNS_TYPE_A) {
        if (uVar8 != 4) {
          return DOH_DNS_RDATA_LEN;
        }
        iVar4 = local_70->numaddr;
        lVar5 = (long)iVar4;
        if (lVar5 < 0x18) {
          local_58[lVar5].type = 1;
          *(undefined4 *)&local_58[lVar5].ip = *(undefined4 *)(doh + (int)uVar13);
          goto LAB_003fe277;
        }
      }
      goto LAB_003fe019;
    }
    iVar4 = local_70->numcname;
    if ((long)iVar4 != 4) {
      local_70->numcname = iVar4 + 1;
      c = local_40 + iVar4;
      uVar6 = 0xffffff81;
      local_5c = DVar12;
      local_48 = c;
      do {
        if (dohlen <= (uVar15 & 0xffffffff)) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        bVar1 = doh[uVar15 & 0xffffffff];
        uVar10 = (ulong)bVar1;
        uVar13 = (uint)bVar1;
        uVar7 = uVar6;
        if ((bVar1 & 0xc0) == 0) {
          uVar14 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar14;
          if (uVar10 != 0) {
            local_68 = uVar10;
            local_38 = uVar6;
            if (c->len != 0) {
              local_50 = (ulong)uVar14;
              DVar3 = cnameappend(c,".",1);
              uVar14 = (uint)local_50;
              if (DVar3 != DOH_OK) {
                return DVar3;
              }
            }
            uVar13 = (uint)local_68;
            if (dohlen < uVar14 + uVar13) {
              return DOH_DNS_BAD_LABEL;
            }
            len = local_68;
            local_68 = (ulong)(uVar14 + uVar13);
            DVar3 = cnameappend(c,doh + uVar14,len);
            uVar7 = local_38;
            uVar15 = local_68;
            c = local_48;
            DVar12 = local_5c;
            if (DVar3 != DOH_OK) {
              return DVar3;
            }
          }
        }
        else {
          if ((bVar1 & 0xc0) != 0xc0) {
            return DOH_DNS_BAD_LABEL;
          }
          uVar15 = (ulong)((int)uVar15 + 1);
          if (dohlen <= uVar15) {
            return DOH_DNS_OUT_OF_RANGE;
          }
          uVar15 = (ulong)((uint)doh[uVar15] | (bVar1 & 0x3f) << 8);
        }
      } while ((uVar13 != 0) && (uVar6 = (ulong)((int)uVar7 + 1), (int)uVar7 != 0));
      uVar17 = local_72;
      if ((char)uVar13 != '\0') {
        return DOH_DNS_LABEL_LOOP;
      }
    }
  } while( true );
}

Assistant:

UNITTEST DOHcode doh_decode(unsigned char *doh,
                            size_t dohlen,
                            DNStype dnstype,
                            struct dohentry *d)
{
  unsigned char rcode;
  unsigned short qdcount;
  unsigned short ancount;
  unsigned short type = 0;
  unsigned short rdlength;
  unsigned short nscount;
  unsigned short arcount;
  unsigned int index = 12;
  DOHcode rc;

  if(dohlen < 12)
    return DOH_TOO_SMALL_BUFFER; /* too small */
  if(!doh || doh[0] || doh[1])
    return DOH_DNS_BAD_ID; /* bad ID */
  rcode = doh[3] & 0x0f;
  if(rcode)
    return DOH_DNS_BAD_RCODE; /* bad rcode */

  qdcount = get16bit(doh, 4);
  while(qdcount) {
    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */
    if(dohlen < (index + 4))
      return DOH_DNS_OUT_OF_RANGE;
    index += 4; /* skip question's type and class */
    qdcount--;
  }

  ancount = get16bit(doh, 6);
  while(ancount) {
    unsigned short class;
    unsigned int ttl;

    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    type = get16bit(doh, index);
    if((type != DNS_TYPE_CNAME) && (type != dnstype))
      /* Not the same type as was asked for nor CNAME */
      return DOH_DNS_UNEXPECTED_TYPE;
    index += 2;

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;
    class = get16bit(doh, index);
    if(DNS_CLASS_IN != class)
      return DOH_DNS_UNEXPECTED_CLASS; /* unsupported */
    index += 2;

    if(dohlen < (index + 4))
      return DOH_DNS_OUT_OF_RANGE;

    ttl = get32bit(doh, index);
    if(ttl < d->ttl)
      d->ttl = ttl;
    index += 4;

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;

    rc = rdata(doh, dohlen, rdlength, type, index, d);
    if(rc)
      return rc; /* bad rdata */
    index += rdlength;
    ancount--;
  }

  nscount = get16bit(doh, 8);
  while(nscount) {
    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 8))
      return DOH_DNS_OUT_OF_RANGE;

    index += 2 + 2 + 4; /* type, class and ttl */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;
    index += rdlength;
    nscount--;
  }

  arcount = get16bit(doh, 10);
  while(arcount) {
    rc = skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 8))
      return DOH_DNS_OUT_OF_RANGE;

    index += 2 + 2 + 4; /* type, class and ttl */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;
    index += rdlength;
    arcount--;
  }

  if(index != dohlen)
    return DOH_DNS_MALFORMAT; /* something is wrong */

  if((type != DNS_TYPE_NS) && !d->numcname && !d->numaddr)
    /* nothing stored! */
    return DOH_NO_CONTENT;

  return DOH_OK; /* ok */
}